

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O2

void __thiscall lzham::task_pool::join(task_pool *this)

{
  bool bVar1;
  task tsk;
  
  tsk.field_2._0_4_ = 0;
  tsk._20_8_ = 0;
  tsk.m_data = 0;
  tsk.m_pData_ptr._0_4_ = 0;
  tsk.m_pData_ptr._4_4_ = 0;
  while (0 < this->m_num_outstanding_tasks) {
    bVar1 = tsstack<lzham::task_pool::task,_16U>::pop(&this->m_task_stack,&tsk);
    if (bVar1) {
      process_task(this,&tsk);
    }
    else {
      lzham_sleep(1);
    }
  }
  return;
}

Assistant:

void task_pool::join()
   {
      task tsk;
      while (atomic_add32(&m_num_outstanding_tasks, 0) > 0)
      {
         if (m_task_stack.pop(tsk))
         {
            process_task(tsk);
         }
         else
         {
            lzham_sleep(1);
         }
      }
   }